

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codaeval.c
# Opt level: O2

void print_help(void)

{
  puts("Usage:");
  puts("    codaeval [-D definitionpath] [<options>] expression [<files|directories>]");
  puts("        Evaluate a CODA expression on a series of files and/or recursively on");
  puts("        all contents of directories");
  puts("        If no files or directories are provided then codaeval should be a");
  puts("        \'constant\' expression (i.e. it may not contain node expressions or");
  puts("        functions that rely on product content)");
  putchar(10);
  puts("        Options:");
  puts("            -c, --check");
  puts("                    only check the syntax of the expression, without evaluating");
  puts("                    it; any remaining options (including files) will be ignored");
  puts("            -d, --disable_conversions");
  puts("                    do not perform unit/value conversions");
  puts("            -p \'<path>\'");
  puts("                    a path (in the form of a CODA node expression) to the");
  puts("                    location in the product where the expression should be");
  puts("                    evaluated");
  puts("                    if no path is provided the expression will be evaluated");
  puts("                    at the root of the product");
  putchar(10);
  puts("    A description of the syntax of CODA expression language can be found in the");
  puts("    CODA documentation");
  putchar(10);
  puts("    codaeval h, --help");
  puts("        Show help (this text)");
  putchar(10);
  puts("    codaeval -v, --version");
  puts("        Print the version number of CODA and exit");
  putchar(10);
  puts("    CODA will look for .codadef files using a definition path, which is a");
  puts("    \':\' separated (\';\' on Windows) list of paths to .codadef files and/or");
  puts("    to directories containing .codadef files.");
  puts("    By default the definition path is set to a single directory relative");
  puts("    to the tool location. A different definition path can be set via the");
  puts("    CODA_DEFINITION environment variable or via the -D option.");
  puts("    (the -D option overrides the environment variable setting).");
  putchar(10);
  return;
}

Assistant:

static void print_help(void)
{
    printf("Usage:\n");
    printf("    codaeval [-D definitionpath] [<options>] expression [<files|directories>]\n");
    printf("        Evaluate a CODA expression on a series of files and/or recursively on\n");
    printf("        all contents of directories\n");
    printf("        If no files or directories are provided then codaeval should be a\n");
    printf("        'constant' expression (i.e. it may not contain node expressions or\n");
    printf("        functions that rely on product content)\n");
    printf("\n");
    printf("        Options:\n");
    printf("            -c, --check\n");
    printf("                    only check the syntax of the expression, without evaluating\n");
    printf("                    it; any remaining options (including files) will be ignored\n");
    printf("            -d, --disable_conversions\n");
    printf("                    do not perform unit/value conversions\n");
    printf("            -p '<path>'\n");
    printf("                    a path (in the form of a CODA node expression) to the\n");
    printf("                    location in the product where the expression should be\n");
    printf("                    evaluated\n");
    printf("                    if no path is provided the expression will be evaluated\n");
    printf("                    at the root of the product\n");
    printf("\n");
    printf("    A description of the syntax of CODA expression language can be found in the\n");
    printf("    CODA documentation\n");
    printf("\n");
    printf("    codaeval h, --help\n");
    printf("        Show help (this text)\n");
    printf("\n");
    printf("    codaeval -v, --version\n");
    printf("        Print the version number of CODA and exit\n");
    printf("\n");
    printf("    CODA will look for .codadef files using a definition path, which is a\n");
    printf("    ':' separated (';' on Windows) list of paths to .codadef files and/or\n");
    printf("    to directories containing .codadef files.\n");
    printf("    By default the definition path is set to a single directory relative\n");
    printf("    to the tool location. A different definition path can be set via the\n");
    printf("    CODA_DEFINITION environment variable or via the -D option.\n");
    printf("    (the -D option overrides the environment variable setting).\n");
    printf("\n");
}